

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuerySegment.hpp
# Opt level: O1

void __thiscall
cppjieba::QuerySegment::Cut
          (QuerySegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res,bool hmm)

{
  pointer *ppWVar1;
  const_iterator pRVar2;
  iterator iVar3;
  DictUnit *pDVar4;
  ulong uVar5;
  long lVar6;
  WordRange *__args;
  WordRange wr;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> mixRes;
  WordRange local_58;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> local_48;
  
  local_48.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_start = (WordRange *)0x0;
  local_48.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_finish = (WordRange *)0x0;
  local_48.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MixSegment::Cut(&this->mixSeg_,begin,end,&local_48,hmm);
  __args = local_48.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl
      .super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    do {
      if ((((long)__args->right - (long)__args->left >> 2) * -0x3333333333333333 - 2U <
           0xfffffffffffffffd) &&
         (((long)__args->right - (long)__args->left >> 2) * -0x3333333333333333 - 1U <
          0xfffffffffffffffe)) {
        uVar5 = 1;
        lVar6 = 0x28;
        do {
          pRVar2 = __args->left;
          local_58.left = (const_iterator)((long)&pRVar2[-2].rune + lVar6);
          local_58.right = (const_iterator)((long)&pRVar2[-1].rune + lVar6);
          pDVar4 = Trie::Find(this->trie_->trie_,local_58.left,
                              (const_iterator)((long)&pRVar2->rune + lVar6));
          if (pDVar4 != (DictUnit *)0x0) {
            iVar3._M_current =
                 (res->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (res->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>>::
              _M_realloc_insert<cppjieba::WordRange_const&>
                        ((vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>> *)res,
                         iVar3,&local_58);
            }
            else {
              (iVar3._M_current)->left = local_58.left;
              (iVar3._M_current)->right = local_58.right;
              ppWVar1 = &(res->
                         super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppWVar1 = *ppWVar1 + 1;
            }
          }
          uVar5 = uVar5 + 1;
          lVar6 = lVar6 + 0x14;
        } while (uVar5 < ((long)__args->right - (long)__args->left >> 2) * -0x3333333333333333 + 1U)
        ;
      }
      if ((((long)__args->right - (long)__args->left >> 2) * -0x3333333333333333 - 3U <
           0xfffffffffffffffc) &&
         (((long)__args->right - (long)__args->left >> 2) * -0x3333333333333333 - 2U <
          0xfffffffffffffffd)) {
        uVar5 = 2;
        lVar6 = 0x3c;
        do {
          pRVar2 = __args->left;
          local_58.left = (const_iterator)((long)&pRVar2[-3].rune + lVar6);
          local_58.right = (const_iterator)((long)&pRVar2[-1].rune + lVar6);
          pDVar4 = Trie::Find(this->trie_->trie_,local_58.left,
                              (const_iterator)((long)&pRVar2->rune + lVar6));
          if (pDVar4 != (DictUnit *)0x0) {
            iVar3._M_current =
                 (res->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (res->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>>::
              _M_realloc_insert<cppjieba::WordRange_const&>
                        ((vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>> *)res,
                         iVar3,&local_58);
            }
            else {
              (iVar3._M_current)->left = local_58.left;
              (iVar3._M_current)->right = local_58.right;
              ppWVar1 = &(res->
                         super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppWVar1 = *ppWVar1 + 1;
            }
          }
          uVar5 = uVar5 + 1;
          lVar6 = lVar6 + 0x14;
        } while (uVar5 < ((long)__args->right - (long)__args->left >> 2) * -0x3333333333333333 + 1U)
        ;
      }
      iVar3._M_current =
           (res->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (res->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>>::
        _M_realloc_insert<cppjieba::WordRange_const&>
                  ((vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>> *)res,iVar3,
                   __args);
      }
      else {
        pRVar2 = __args->right;
        (iVar3._M_current)->left = __args->left;
        (iVar3._M_current)->right = pRVar2;
        ppWVar1 = &(res->
                   super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppWVar1 = *ppWVar1 + 1;
      }
      __args = __args + 1;
    } while (__args != local_48.
                       super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_48.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl
      .super__Vector_impl_data._M_start != (WordRange *)0x0) {
    operator_delete(local_48.
                    super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Cut(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end, vector<WordRange>& res, bool hmm) const {
    //use mix Cut first
    vector<WordRange> mixRes;
    mixSeg_.Cut(begin, end, mixRes, hmm);

    vector<WordRange> fullRes;
    for (vector<WordRange>::const_iterator mixResItr = mixRes.begin(); mixResItr != mixRes.end(); mixResItr++) {
      if (mixResItr->Length() > 2) {
        for (size_t i = 0; i + 1 < mixResItr->Length(); i++) {
          WordRange wr(mixResItr->left + i, mixResItr->left + i + 1);
          if (trie_->Find(wr.left, wr.right + 1) != NULL) {
            res.push_back(wr);
          }
        }
      }
      if (mixResItr->Length() > 3) {
        for (size_t i = 0; i + 2 < mixResItr->Length(); i++) {
          WordRange wr(mixResItr->left + i, mixResItr->left + i + 2);
          if (trie_->Find(wr.left, wr.right + 1) != NULL) {
            res.push_back(wr);
          }
        }
      }
      res.push_back(*mixResItr);
    }
  }